

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  ImGuiIO *pIVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  GLFWwindow *in_RDI;
  int in_R8D;
  ImGuiIO *io;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  
  if (g_PrevUserCallbackKey != (GLFWkeyfun)0x0) {
    (*g_PrevUserCallbackKey)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D);
  }
  pIVar1 = ImGui::GetIO();
  if (in_ECX == 1) {
    pIVar1->KeysDown[in_ESI] = true;
  }
  if (in_ECX == 0) {
    pIVar1->KeysDown[in_ESI] = false;
  }
  local_21 = 1;
  if ((pIVar1->KeysDown[0x155] & 1U) == 0) {
    local_21 = pIVar1->KeysDown[0x159];
  }
  pIVar1->KeyCtrl = (bool)(local_21 & 1);
  local_22 = 1;
  if ((pIVar1->KeysDown[0x154] & 1U) == 0) {
    local_22 = pIVar1->KeysDown[0x158];
  }
  pIVar1->KeyShift = (bool)(local_22 & 1);
  local_23 = 1;
  if ((pIVar1->KeysDown[0x156] & 1U) == 0) {
    local_23 = pIVar1->KeysDown[0x15a];
  }
  pIVar1->KeyAlt = (bool)(local_23 & 1);
  local_24 = 1;
  if ((pIVar1->KeysDown[0x157] & 1U) == 0) {
    local_24 = pIVar1->KeysDown[0x15b];
  }
  pIVar1->KeySuper = (bool)(local_24 & 1);
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (g_PrevUserCallbackKey != NULL)
        g_PrevUserCallbackKey(window, key, scancode, action, mods);

    ImGuiIO& io = ImGui::GetIO();
    if (action == GLFW_PRESS)
        io.KeysDown[key] = true;
    if (action == GLFW_RELEASE)
        io.KeysDown[key] = false;

    // Modifiers are not reliable across systems
    io.KeyCtrl = io.KeysDown[GLFW_KEY_LEFT_CONTROL] || io.KeysDown[GLFW_KEY_RIGHT_CONTROL];
    io.KeyShift = io.KeysDown[GLFW_KEY_LEFT_SHIFT] || io.KeysDown[GLFW_KEY_RIGHT_SHIFT];
    io.KeyAlt = io.KeysDown[GLFW_KEY_LEFT_ALT] || io.KeysDown[GLFW_KEY_RIGHT_ALT];
#ifdef _WIN32
    io.KeySuper = false;
#else
    io.KeySuper = io.KeysDown[GLFW_KEY_LEFT_SUPER] || io.KeysDown[GLFW_KEY_RIGHT_SUPER];
#endif
}